

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

bool tinyusdz::Path::LessThan(Path *lhs,Path *rhs)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  char *__s1;
  size_t sVar4;
  char *__s2;
  pointer pcVar5;
  size_type sVar6;
  pointer pcVar7;
  pointer pbVar8;
  pointer pbVar9;
  size_type sVar10;
  int iVar11;
  ulong uVar12;
  size_type sVar13;
  pointer pcVar14;
  pointer pcVar15;
  size_type sVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rhs_prim_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lhs_prim_names;
  long *local_a8 [2];
  long local_98 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  ulong local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (lhs->_valid == true) {
    if (rhs->_valid != true) {
      return true;
    }
    sVar3 = (lhs->_prim_part)._M_string_length;
    if ((sVar3 != 0) && (__s1 = (lhs->_prim_part)._M_dataplus._M_p, *__s1 == '/')) {
      sVar4 = (rhs->_prim_part)._M_string_length;
      if (sVar4 == 0) {
        return true;
      }
      __s2 = (rhs->_prim_part)._M_dataplus._M_p;
      if (*__s2 != '/') {
        return true;
      }
      if ((sVar3 != sVar4) || (iVar11 = bcmp(__s1,__s2,sVar3), iVar11 != 0)) {
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"/","");
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar19 = 0x147ae15;
        uVar12 = 0;
        do {
          uVar12 = std::__cxx11::string::find_first_not_of((char *)lhs,(ulong)local_a8[0],uVar12);
          if (uVar12 == 0xffffffffffffffff) break;
          uVar12 = std::__cxx11::string::find((char *)lhs,(ulong)local_a8[0],uVar12);
          std::__cxx11::string::substr((ulong)&local_68,(ulong)lhs);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                     &local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0],local_98[0] + 1);
        }
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"/","");
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar19 = 0x147ae15;
        uVar12 = 0;
        do {
          uVar12 = std::__cxx11::string::find_first_not_of((char *)rhs,(ulong)local_a8[0],uVar12);
          if (uVar12 == 0xffffffffffffffff) break;
          uVar12 = std::__cxx11::string::find((char *)rhs,(ulong)local_a8[0],uVar12);
          std::__cxx11::string::substr((ulong)&local_68,(ulong)rhs);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                     &local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0],local_98[0] + 1);
        }
        pbVar9 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 = local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar22 = local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                   local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        else if (local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
          bVar22 = false;
        }
        else {
          uVar18 = (long)local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          local_70 = (long)local_88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
          uVar12 = uVar18;
          if (local_70 < uVar18) {
            uVar12 = local_70;
          }
          if (uVar12 != 0) {
            lVar19 = 8;
            uVar20 = uVar12;
            do {
              sVar3 = *(size_t *)((long)&(pbVar9->_M_dataplus)._M_p + lVar19);
              if ((sVar3 != *(size_t *)((long)&(pbVar8->_M_dataplus)._M_p + lVar19)) ||
                 ((sVar3 != 0 &&
                  (iVar11 = bcmp(*(void **)((long)pbVar9 + lVar19 + -8),
                                 *(void **)((long)pbVar8 + lVar19 + -8),sVar3), iVar11 != 0)))) {
                if (uVar12 == 1) {
                  lVar21 = 0;
                }
                else {
                  lVar19 = uVar12 - 2;
                  if (lVar19 == 0) {
                    lVar21 = 1;
                  }
                  else {
                    lVar21 = uVar12 - 1;
                    lVar17 = uVar12 * 0x20 + -0x38;
                    do {
                      sVar3 = *(size_t *)((long)&(pbVar9->_M_dataplus)._M_p + lVar17);
                      if (sVar3 == *(size_t *)((long)&(pbVar8->_M_dataplus)._M_p + lVar17)) {
                        if (sVar3 != 0) {
                          iVar11 = bcmp(*(void **)((long)pbVar9 + lVar17 + -8),
                                        *(void **)((long)pbVar8 + lVar17 + -8),sVar3);
                          lVar21 = lVar21 + -1 + (ulong)(iVar11 == 0);
                        }
                      }
                      else {
                        lVar21 = lVar21 + -1;
                      }
                      lVar17 = lVar17 + -0x20;
                      lVar19 = lVar19 + -1;
                    } while (lVar19 != 0);
                  }
                }
                pcVar5 = pbVar9[lVar21]._M_dataplus._M_p;
                sVar6 = pbVar9[lVar21]._M_string_length;
                pcVar7 = pbVar8[lVar21]._M_dataplus._M_p;
                sVar13 = pbVar8[lVar21]._M_string_length;
                pcVar14 = pcVar7;
                pcVar15 = pcVar5;
                if ((sVar6 != 0) && (sVar13 != 0)) {
                  lVar19 = 0;
                  do {
                    if (pcVar7[lVar19] != pcVar5[lVar19]) {
                      bVar22 = pcVar5[lVar19] < pcVar7[lVar19];
                      goto LAB_00122120;
                    }
                    lVar21 = lVar19 + 1;
                  } while ((sVar6 - 1 != lVar19) &&
                          (bVar22 = sVar13 - 1 != lVar19, lVar19 = lVar21, bVar22));
                  pcVar15 = pcVar5 + lVar21;
                  pcVar14 = pcVar7 + lVar21;
                }
                bVar22 = pcVar14 != pcVar7 + sVar13 && pcVar15 == pcVar5 + sVar6;
                goto LAB_00122120;
              }
              lVar19 = lVar19 + 0x20;
              uVar20 = uVar20 - 1;
            } while (uVar20 != 0);
          }
          bVar22 = uVar18 < local_70;
        }
LAB_00122120:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        return bVar22;
      }
      sVar6 = (lhs->_prop_part)._M_string_length;
      if (sVar6 == 0) {
        return true;
      }
      sVar13 = (rhs->_prop_part)._M_string_length;
      if (sVar13 != 0) {
        sVar13 = sVar13 - 1;
        sVar10 = 0;
        do {
          sVar16 = sVar10;
          cVar1 = (lhs->_prop_part)._M_dataplus._M_p[sVar16];
          cVar2 = (rhs->_prop_part)._M_dataplus._M_p[sVar16];
          if (cVar2 != cVar1) {
            return cVar1 < cVar2;
          }
        } while ((sVar6 - 1 != sVar16) && (sVar10 = sVar16 + 1, sVar13 != sVar16));
        return sVar6 == sVar16 + 1 && sVar13 != sVar16;
      }
    }
  }
  return false;
}

Assistant:

bool Path::LessThan(const Path &lhs, const Path &rhs) {
  // DCOUT("LessThan");
  if (lhs.is_valid() && rhs.is_valid()) {
    // ok
  } else {
    // Even though this should not happen,
    // valid paths is less than invalid paths
    return lhs.is_valid();
  }

  // TODO: handle relative path correctly.
  if (lhs.is_absolute_path() && rhs.is_absolute_path()) {
    // ok
  } else {
    // Absolute paths are less than relative paths
    return lhs.is_absolute_path();
  }

  if (lhs.prim_part() == rhs.prim_part()) {
    // compare property
    const std::string &lhs_prop_part = lhs.prop_part();
    const std::string &rhs_prop_part = rhs.prop_part();

    if (lhs_prop_part.empty() || rhs_prop_part.empty()) {
      return lhs_prop_part.empty();
    }

    return ::tinyusdz::lexicographical_compare(
        lhs_prop_part.begin(), lhs_prop_part.end(), rhs_prop_part.begin(),
        rhs_prop_part.end());

  } else {
    const std::vector<std::string> lhs_prim_names = split(lhs.prim_part(), "/");
    const std::vector<std::string> rhs_prim_names = split(rhs.prim_part(), "/");
    // DCOUT("lhs_names = " << to_string(lhs_prim_names));
    // DCOUT("rhs_names = " << to_string(rhs_prim_names));

    if (lhs_prim_names.empty() || rhs_prim_names.empty()) {
      return lhs_prim_names.empty() && rhs_prim_names.size();
    }

    // common shortest depth.
    size_t didx = (std::min)(lhs_prim_names.size(), rhs_prim_names.size());

    bool same_until_common_depth = true;
    for (size_t i = 0; i < didx; i++) {
      if (lhs_prim_names[i] != rhs_prim_names[i]) {
        same_until_common_depth = false;
        break;
      }
    }

    if (same_until_common_depth) {
      // tail differs. compare by depth count.
      return lhs_prim_names.size() < rhs_prim_names.size();
    }

    // Walk until common ancestor is found
    size_t child_idx = didx - 1;
    // DCOUT("common_depth_idx = " << didx << ", lcount = " <<
    // lhs_prim_names.size() << ", rcount = " << rhs_prim_names.size());
    if (didx > 1) {
      for (size_t parent_idx = didx - 2; parent_idx > 0; parent_idx--) {
        // DCOUT("parent_idx = " << parent_idx);
        if (lhs_prim_names[parent_idx] != rhs_prim_names[parent_idx]) {
          child_idx--;
        }
      }
    }
    // DCOUT("child_idx = " << child_idx);

    // compare child node
    return ::tinyusdz::lexicographical_compare(
        lhs_prim_names[child_idx].begin(), lhs_prim_names[child_idx].end(),
        rhs_prim_names[child_idx].begin(), rhs_prim_names[child_idx].end());
  }
}